

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_sse42_intr.c
# Opt level: O1

void ihevc_intra_pred_chroma_dc_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar17 [16];
  
  uVar5 = nt << 0x1e | nt - 4U >> 2;
  bVar3 = 6;
  if (uVar5 < 4) {
    bVar3 = (byte)*(undefined4 *)(&DAT_001722a0 + (ulong)uVar5 * 4);
  }
  if (nt == 4) {
    auVar10 = *(undefined1 (*) [16])(pu1_ref + 8);
    auVar11 = pmovzxbw(in_XMM1,auVar10);
    auVar12[1] = 0;
    auVar12[0] = auVar10[8];
    auVar12[2] = auVar10[9];
    auVar12[3] = 0;
    auVar12[4] = auVar10[10];
    auVar12[5] = 0;
    auVar12[6] = auVar10[0xb];
    auVar12[7] = 0;
    auVar12[8] = auVar10[0xc];
    auVar12[9] = 0;
    auVar12[10] = auVar10[0xd];
    auVar12[0xb] = 0;
    auVar12[0xc] = auVar10[0xe];
    auVar12[0xd] = 0;
    auVar12[0xe] = auVar10[0xf];
    auVar12[0xf] = 0;
LAB_00153371:
    auVar10._0_2_ = auVar12._0_2_ + auVar11._0_2_;
    auVar10._2_2_ = auVar12._2_2_ + auVar11._2_2_;
    auVar10._4_2_ = auVar12._4_2_ + auVar11._4_2_;
    auVar10._6_2_ = auVar12._6_2_ + auVar11._6_2_;
    auVar10._8_2_ = auVar12._8_2_ + auVar11._8_2_;
    auVar10._10_2_ = auVar12._10_2_ + auVar11._10_2_;
    auVar10._12_2_ = auVar12._12_2_ + auVar11._12_2_;
    auVar10._14_2_ = auVar12._14_2_ + auVar11._14_2_;
  }
  else {
    if (nt == 8) {
      auVar10 = *(undefined1 (*) [16])(pu1_ref + 0x10);
      auVar2 = *(undefined1 (*) [16])(pu1_ref + 0x20);
      auVar12 = pmovzxbw(in_XMM2,auVar10);
      auVar13 = pmovzxbw(in_XMM3,auVar2);
      auVar11._0_2_ = (ushort)auVar10[8] + auVar12._0_2_;
      auVar11._2_2_ = (ushort)auVar10[9] + auVar12._2_2_;
      auVar11._4_2_ = (ushort)auVar10[10] + auVar12._4_2_;
      auVar11._6_2_ = (ushort)auVar10[0xb] + auVar12._6_2_;
      auVar11._8_2_ = (ushort)auVar10[0xc] + auVar12._8_2_;
      auVar11._10_2_ = (ushort)auVar10[0xd] + auVar12._10_2_;
      auVar11._12_2_ = (ushort)auVar10[0xe] + auVar12._12_2_;
      auVar11._14_2_ = (ushort)auVar10[0xf] + auVar12._14_2_;
      auVar12._0_2_ = (ushort)auVar2[8] + auVar13._0_2_;
      auVar12._2_2_ = (ushort)auVar2[9] + auVar13._2_2_;
      auVar12._4_2_ = (ushort)auVar2[10] + auVar13._4_2_;
      auVar12._6_2_ = (ushort)auVar2[0xb] + auVar13._6_2_;
      auVar12._8_2_ = (ushort)auVar2[0xc] + auVar13._8_2_;
      auVar12._10_2_ = (ushort)auVar2[0xd] + auVar13._10_2_;
      auVar12._12_2_ = (ushort)auVar2[0xe] + auVar13._12_2_;
      auVar12._14_2_ = (ushort)auVar2[0xf] + auVar13._14_2_;
      goto LAB_00153371;
    }
    iVar4 = 0;
    iVar6 = 0;
    if (nt != 0x10) goto LAB_0015339b;
    auVar12 = *(undefined1 (*) [16])(pu1_ref + 0x20);
    auVar11 = *(undefined1 (*) [16])(pu1_ref + 0x30);
    auVar2 = *(undefined1 (*) [16])(pu1_ref + 0x40);
    auVar13 = *(undefined1 (*) [16])(pu1_ref + 0x50);
    auVar14 = pmovzxbw(in_XMM4,auVar12);
    auVar15 = pmovzxbw(in_XMM5,auVar11);
    auVar16 = pmovzxbw(in_XMM6,auVar2);
    auVar17 = pmovzxbw(in_XMM7,auVar13);
    auVar10._0_2_ =
         (ushort)auVar13[8] + (ushort)auVar2[8] + auVar16._0_2_ +
         (ushort)auVar11[8] + auVar15._0_2_ + (ushort)auVar12[8] + auVar14._0_2_ + auVar17._0_2_;
    auVar10._2_2_ =
         (ushort)auVar13[9] + (ushort)auVar2[9] + auVar16._2_2_ +
         (ushort)auVar11[9] + auVar15._2_2_ + (ushort)auVar12[9] + auVar14._2_2_ + auVar17._2_2_;
    auVar10._4_2_ =
         (ushort)auVar13[10] + (ushort)auVar2[10] + auVar16._4_2_ +
         (ushort)auVar11[10] + auVar15._4_2_ + (ushort)auVar12[10] + auVar14._4_2_ + auVar17._4_2_;
    auVar10._6_2_ =
         (ushort)auVar13[0xb] + (ushort)auVar2[0xb] + auVar16._6_2_ +
         (ushort)auVar11[0xb] + auVar15._6_2_ + (ushort)auVar12[0xb] + auVar14._6_2_ + auVar17._6_2_
    ;
    auVar10._8_2_ =
         (ushort)auVar13[0xc] + (ushort)auVar2[0xc] + auVar16._8_2_ +
         (ushort)auVar11[0xc] + auVar15._8_2_ + (ushort)auVar12[0xc] + auVar14._8_2_ + auVar17._8_2_
    ;
    auVar10._10_2_ =
         (ushort)auVar13[0xd] + (ushort)auVar2[0xd] + auVar16._10_2_ +
         (ushort)auVar11[0xd] + auVar15._10_2_ + (ushort)auVar12[0xd] + auVar14._10_2_ +
         auVar17._10_2_;
    auVar10._12_2_ =
         (ushort)auVar13[0xe] + (ushort)auVar2[0xe] + auVar16._12_2_ +
         (ushort)auVar11[0xe] + auVar15._12_2_ + (ushort)auVar12[0xe] + auVar14._12_2_ +
         auVar17._12_2_;
    auVar10._14_2_ =
         (ushort)auVar13[0xf] + (ushort)auVar2[0xf] + auVar16._14_2_ +
         (ushort)auVar11[0xf] + auVar15._14_2_ + (ushort)auVar12[0xf] + auVar14._14_2_ +
         auVar17._14_2_;
  }
  auVar10 = pshufb(auVar10,(undefined1  [16])IHEVCE_SHUFFLEMASKY9);
  auVar10 = phaddw(auVar10,auVar10);
  auVar10 = phaddw(auVar10,auVar10);
  auVar10 = pmovsxwd(auVar10,auVar10);
  iVar6 = auVar10._0_4_;
  iVar4 = auVar10._4_4_;
LAB_0015339b:
  lVar7 = (long)nt;
  auVar10 = ZEXT416((uint)(((int)((iVar4 + nt + (uint)pu1_ref[(long)(int)(lVar7 * 6) + 1]) -
                                 (uint)pu1_ref[(long)(int)(lVar7 << 2) + 1]) >> (bVar3 & 0x1f)) << 8
                          | (int)((iVar6 + nt + (uint)pu1_ref[lVar7 * 6]) - (uint)pu1_ref[lVar7 * 4]
                                 ) >> (bVar3 & 0x1f)));
  if (nt == 8) {
    auVar10 = pshuflw(auVar10,auVar10,0);
    uVar8 = auVar10._0_4_;
    *(undefined4 *)pu1_dst = uVar8;
    *(undefined4 *)(pu1_dst + 4) = uVar8;
    *(undefined4 *)(pu1_dst + 8) = uVar8;
    *(undefined4 *)(pu1_dst + 0xc) = uVar8;
    lVar7 = (long)dst_strd;
    pUVar1 = pu1_dst + lVar7;
    *(undefined4 *)pUVar1 = uVar8;
    *(undefined4 *)(pUVar1 + 4) = uVar8;
    *(undefined4 *)(pUVar1 + 8) = uVar8;
    *(undefined4 *)(pUVar1 + 0xc) = uVar8;
    pUVar1 = pu1_dst + lVar7 * 2;
    *(undefined4 *)pUVar1 = uVar8;
    *(undefined4 *)(pUVar1 + 4) = uVar8;
    *(undefined4 *)(pUVar1 + 8) = uVar8;
    *(undefined4 *)(pUVar1 + 0xc) = uVar8;
    pUVar1 = pu1_dst + lVar7 * 3;
    *(undefined4 *)pUVar1 = uVar8;
    *(undefined4 *)(pUVar1 + 4) = uVar8;
    *(undefined4 *)(pUVar1 + 8) = uVar8;
    *(undefined4 *)(pUVar1 + 0xc) = uVar8;
    pUVar1 = pu1_dst + lVar7 * 4;
    *(undefined4 *)pUVar1 = uVar8;
    *(undefined4 *)(pUVar1 + 4) = uVar8;
    *(undefined4 *)(pUVar1 + 8) = uVar8;
    *(undefined4 *)(pUVar1 + 0xc) = uVar8;
    pUVar1 = pu1_dst + lVar7 * 5;
    *(undefined4 *)pUVar1 = uVar8;
    *(undefined4 *)(pUVar1 + 4) = uVar8;
    *(undefined4 *)(pUVar1 + 8) = uVar8;
    *(undefined4 *)(pUVar1 + 0xc) = uVar8;
    pUVar1 = pu1_dst + lVar7 * 6;
    *(undefined4 *)pUVar1 = uVar8;
    *(undefined4 *)(pUVar1 + 4) = uVar8;
    *(undefined4 *)(pUVar1 + 8) = uVar8;
    *(undefined4 *)(pUVar1 + 0xc) = uVar8;
    pUVar1 = pu1_dst + lVar7 * 7;
    *(undefined4 *)pUVar1 = uVar8;
    *(undefined4 *)(pUVar1 + 4) = uVar8;
    *(undefined4 *)(pUVar1 + 8) = uVar8;
    *(undefined4 *)(pUVar1 + 0xc) = uVar8;
  }
  else if (nt == 4) {
    auVar10 = pshuflw(auVar10,auVar10,0);
    uVar9 = auVar10._0_8_;
    *(undefined8 *)pu1_dst = uVar9;
    lVar7 = (long)dst_strd;
    *(undefined8 *)(pu1_dst + lVar7) = uVar9;
    *(undefined8 *)(pu1_dst + lVar7 * 2) = uVar9;
    *(undefined8 *)(pu1_dst + lVar7 * 3) = uVar9;
  }
  else if (0 < nt) {
    auVar10 = pshuflw(auVar10,auVar10,0);
    uVar8 = auVar10._0_4_;
    lVar7 = (long)dst_strd;
    iVar4 = 0;
    do {
      *(undefined4 *)pu1_dst = uVar8;
      *(undefined4 *)(pu1_dst + 4) = uVar8;
      *(undefined4 *)(pu1_dst + 8) = uVar8;
      *(undefined4 *)(pu1_dst + 0xc) = uVar8;
      pUVar1 = pu1_dst + lVar7;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + lVar7 * 2;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + lVar7 * 3;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      *(undefined4 *)(pu1_dst + 0x10) = uVar8;
      *(undefined4 *)(pu1_dst + 0x14) = uVar8;
      *(undefined4 *)(pu1_dst + 0x18) = uVar8;
      *(undefined4 *)(pu1_dst + 0x1c) = uVar8;
      pUVar1 = pu1_dst + lVar7 + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + lVar7 * 2 + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + lVar7 * 3 + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + dst_strd * 4;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + dst_strd * 5;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + dst_strd * 6;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + dst_strd * 7;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + (long)(dst_strd * 4) + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + (long)(dst_strd * 5) + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + (long)(dst_strd * 6) + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + (long)(dst_strd * 7) + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pu1_dst = pu1_dst + dst_strd * 8;
      iVar4 = iVar4 + 8;
    } while (iVar4 < nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_dc_sse42(UWORD8 *pu1_ref,
                                      WORD32 src_strd,
                                      UWORD8 *pu1_dst,
                                      WORD32 dst_strd,
                                      WORD32 nt,
                                      WORD32 mode)
{

    WORD32 acc_dc_u, acc_dc_v;
    WORD32 dc_val_u, dc_val_v;
    WORD32 row;
    WORD32 log2nt = 5;
    __m128i src_temp1, src_temp3, src_temp4, src_temp5, src_temp6, m_mask;
    __m128i src_temp7, src_temp8, src_temp9, src_temp10;
    __m128i m_zero = _mm_set1_epi32(0);
    UNUSED(src_strd);
    UNUSED(mode);

    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }

    acc_dc_u = 0;
    acc_dc_v = 0;

    /* Calculate DC value for the transform block */

    m_mask = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASKY9[0]);

    if(nt == 16)
    {
        __m128i temp_sad;

        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt)));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 16));
        src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 32));
        src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 48));

        src_temp5 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp6 =  _mm_cvtepu8_epi16(src_temp4);
        src_temp9 =  _mm_cvtepu8_epi16(src_temp7);
        src_temp10 =  _mm_cvtepu8_epi16(src_temp8);

        src_temp3 = _mm_srli_si128(src_temp3, 8);
        src_temp4 = _mm_srli_si128(src_temp4, 8);
        src_temp7 = _mm_srli_si128(src_temp7, 8);
        src_temp8 = _mm_srli_si128(src_temp8, 8);

        src_temp3 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);
        src_temp7 =  _mm_cvtepu8_epi16(src_temp7);
        src_temp8 =  _mm_cvtepu8_epi16(src_temp8);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp6 = _mm_add_epi16(src_temp3, src_temp5);
        src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
        src_temp10 = _mm_add_epi16(src_temp9, src_temp10);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp8 = _mm_add_epi16(src_temp8, src_temp10);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp8);
        src_temp4 = _mm_shuffle_epi8(src_temp4, m_mask);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        src_temp4 = _mm_cvtepi16_epi32(src_temp4);
        temp_sad  = _mm_srli_si128(src_temp4, 4); /* Next 32 bits */
        acc_dc_u  = _mm_cvtsi128_si32(src_temp4);
        acc_dc_v  = _mm_cvtsi128_si32(temp_sad);
    }

    else if(nt == 8)
    {
        __m128i temp_sad;
        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt)));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 16));

        src_temp5 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp6 =  _mm_cvtepu8_epi16(src_temp4);

        src_temp3 = _mm_srli_si128(src_temp3, 8);
        src_temp4 = _mm_srli_si128(src_temp4, 8);

        src_temp3 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp6 = _mm_add_epi16(src_temp3, src_temp5);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp4 = _mm_shuffle_epi8(src_temp4, m_mask);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        src_temp4 = _mm_cvtepi16_epi32(src_temp4);
        temp_sad  = _mm_srli_si128(src_temp4, 4); /* Next 32 bits */
        acc_dc_u  = _mm_cvtsi128_si32(src_temp4);
        acc_dc_v  = _mm_cvtsi128_si32(temp_sad);
    }

    else if(nt == 4)
    {
        __m128i temp_sad;
        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt)));

        src_temp5 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp4 = _mm_srli_si128(src_temp3, 8);
        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp5);

        src_temp4 = _mm_shuffle_epi8(src_temp4, m_mask);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        src_temp4 = _mm_cvtepi16_epi32(src_temp4);
        temp_sad  = _mm_srli_si128(src_temp4, 4); /* Next 32 bits */
        acc_dc_u  = _mm_cvtsi128_si32(src_temp4);
        acc_dc_v  = _mm_cvtsi128_si32(temp_sad);
    }


    acc_dc_u += pu1_ref[6 * nt];
    acc_dc_v += pu1_ref[6 * nt + 1];

    acc_dc_u -= pu1_ref[4 * nt];
    acc_dc_v -= pu1_ref[4 * nt + 1];

    dc_val_u = (acc_dc_u + nt) >> (log2nt + 1);
    dc_val_v = (acc_dc_v + nt) >> (log2nt + 1);

    dc_val_u = dc_val_u | (dc_val_v << 8);

    /* Fill the remaining rows with DC value*/

    if(nt == 4)
    {
        src_temp1 = _mm_set1_epi16(dc_val_u);

        /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
        _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp1);
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp1);

    }
    else if(nt == 8)
    {
        src_temp1 = _mm_set1_epi16(dc_val_u);

        /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
        _mm_storeu_si128((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp1);

        _mm_storeu_si128((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp1);

    }

    else /* nt == 16 */
    {

        src_temp1 = _mm_set1_epi16(dc_val_u);

        for(row = 0; row < nt; row += 8)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (0 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (1 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (2 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (3 * dst_strd)), src_temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (4 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (5 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (6 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (7 * dst_strd)), src_temp1);

            pu1_dst += 8 * dst_strd;
        }


    }

}